

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

bool run_simple_msgpack_test(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  string *psVar5;
  any *paVar6;
  long lVar7;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
  __l;
  any var2;
  any var;
  form form;
  anon_struct_64_10_cf75279b form_data;
  stringstream ss;
  boolean_validator local_659;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658;
  any local_638;
  any local_628;
  undefined1 local_618 [48];
  string local_5e8;
  string local_5c8;
  string local_5a8;
  string local_588;
  string local_568;
  string local_548;
  string local_528;
  string local_508;
  string local_4e8;
  sub_form local_4c8;
  sub_form local_4b8;
  sub_form local_4a8;
  sub_form local_498;
  sub_form local_488;
  sub_form local_478;
  sub_form local_468;
  sub_form local_458;
  undefined1 local_448 [32];
  undefined1 **local_428;
  _Storage local_420;
  undefined1 *local_418 [2];
  undefined1 local_408 [16];
  code *local_3f8;
  undefined8 local_3f0;
  undefined1 *local_3e8 [2];
  undefined1 local_3d8 [16];
  code *local_3c8;
  undefined8 local_3c0;
  undefined1 *local_3b8 [2];
  undefined1 local_3a8 [16];
  code *local_398;
  undefined8 local_390;
  undefined1 *local_388 [2];
  undefined1 local_378 [16];
  code *local_368;
  undefined8 local_360;
  undefined1 *local_358 [2];
  undefined1 local_348 [16];
  code *local_338;
  undefined8 local_330;
  undefined1 *local_328 [2];
  undefined1 local_318 [16];
  code *local_308;
  undefined8 local_300;
  undefined1 *local_2f8 [2];
  undefined1 local_2e8 [16];
  code *local_2d8;
  undefined8 local_2d0;
  undefined1 *local_2c8 [2];
  undefined1 local_2b8 [16];
  code *local_2a8;
  undefined8 local_2a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  local_298;
  sub_form local_268;
  string_validator local_258;
  sub_form local_248;
  sub_form local_238;
  sub_form local_228;
  sub_form local_218;
  sub_form local_208;
  sub_form local_1f8;
  sub_form local_1e8;
  sub_form local_1d8;
  sub_form local_1c8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_628._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  local_628._M_storage._M_ptr = (void *)0x0;
  local_638._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  local_638._M_storage._M_ptr = (void *)0x0;
  local_448._0_8_ = local_448 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"bool","");
  local_428 = (undefined1 **)std::any::_Manager_internal<bool>::_S_manage;
  local_420 = (_Storage)0x1;
  local_418[0] = local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"int8","");
  local_3f8 = std::any::_Manager_internal<signed_char>::_S_manage;
  local_3f0 = 0xf8;
  local_3e8[0] = local_3d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"int16","");
  local_3c8 = std::any::_Manager_internal<signed_char>::_S_manage;
  local_3c0 = 0xf0;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"int32","");
  local_398 = std::any::_Manager_internal<signed_char>::_S_manage;
  local_390 = 0xe0;
  local_388[0] = local_378;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"int64","");
  local_368 = std::any::_Manager_internal<signed_char>::_S_manage;
  local_360 = 0xc0;
  local_358[0] = local_348;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"uint8","");
  local_338 = std::any::_Manager_internal<unsigned_char>::_S_manage;
  local_330 = 8;
  local_328[0] = local_318;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"uint16","");
  local_308 = std::any::_Manager_internal<unsigned_char>::_S_manage;
  local_300 = 0x10;
  local_2f8[0] = local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"uint32","");
  local_2d8 = std::any::_Manager_internal<unsigned_char>::_S_manage;
  local_2d0 = 0x20;
  local_2c8[0] = local_2b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"uint64","");
  local_2a8 = std::any::_Manager_internal<unsigned_char>::_S_manage;
  local_2a0 = 0x40;
  paVar1 = &local_658.field_2;
  local_658._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_658,"sting value","");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  ::
  pair<const_char_(&)[7],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_298,(char (*) [7])"string",&local_658);
  __l._M_len = 10;
  __l._M_array = (iterator)local_448;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
         *)local_618,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_5c8,(allocator_type *)&local_5e8);
  std::any::operator=(&local_628,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                       *)local_618);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
               *)local_618);
  lVar7 = -0x1e0;
  paVar6 = &local_298.second;
  do {
    if (paVar6->_M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      (*paVar6->_M_manager)(_Op_destroy,paVar6,(_Arg *)0x0);
      paVar6->_M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    }
    if (paVar6 + -1 != (any *)paVar6[-2]._M_manager) {
      operator_delete((any *)paVar6[-2]._M_manager,(ulong)(paVar6[-1]._M_manager + 1));
    }
    paVar6 = paVar6 + -3;
    lVar7 = lVar7 + 0x30;
  } while (lVar7 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658._M_dataplus._M_p != paVar1) {
    operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1);
  }
  goodform::msgpack::serialize(&local_628,local_1a8);
  goodform::msgpack::deserialize((istream *)local_1b8,&local_638);
  goodform::form::form((form *)local_618,&local_638);
  local_658._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_658,"bool","");
  local_1c8 = goodform::sub_form::at((sub_form *)local_618,&local_658);
  local_659 = goodform::sub_form::boolean(&local_1c8);
  bVar3 = goodform::boolean_validator::val(&local_659);
  local_448[0] = (string)bVar3;
  local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c8,"int8","");
  local_1d8 = goodform::sub_form::at((sub_form *)local_618,&local_5c8);
  goodform::sub_form::int8(&local_458);
  local_448[1] = local_458.variant_._0_1_;
  local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e8,"int16","");
  local_1e8 = goodform::sub_form::at((sub_form *)local_618,&local_5e8);
  goodform::sub_form::int16(&local_468);
  local_448._2_2_ = local_468.variant_._0_2_;
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"int32","");
  local_1f8 = goodform::sub_form::at((sub_form *)local_618,&local_4e8);
  goodform::sub_form::int32(&local_478);
  local_448._4_4_ = local_478.variant_._0_4_;
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"int64","");
  local_208 = goodform::sub_form::at((sub_form *)local_618,&local_508);
  goodform::sub_form::int64(&local_488);
  local_448._8_8_ = local_488.variant_;
  local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"uint8","");
  local_218 = goodform::sub_form::at((sub_form *)local_618,&local_528);
  goodform::sub_form::uint8(&local_498);
  local_448[0x10] = (char)local_498.variant_;
  local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"uint16","");
  local_228 = goodform::sub_form::at((sub_form *)local_618,&local_548);
  goodform::sub_form::uint16(&local_4a8);
  local_448._18_2_ = (short)local_4a8.variant_;
  local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"uint32","");
  local_238 = goodform::sub_form::at((sub_form *)local_618,&local_5a8);
  goodform::sub_form::uint32(&local_4b8);
  local_448._20_4_ = (int)local_4b8.variant_;
  local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_568,"uint64","");
  local_248 = goodform::sub_form::at((sub_form *)local_618,&local_568);
  goodform::sub_form::uint64(&local_4c8);
  local_448._24_8_ = local_4c8.variant_;
  local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,"string","");
  local_268 = goodform::sub_form::at((sub_form *)local_618,&local_588);
  local_258 = goodform::sub_form::string(&local_268);
  psVar5 = goodform::string_validator::val_abi_cxx11_(&local_258);
  local_428 = local_418;
  pcVar2 = (psVar5->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_428,pcVar2,pcVar2 + psVar5->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != &local_588.field_2) {
    operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._M_dataplus._M_p != &local_568.field_2) {
    operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
    operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_dataplus._M_p != &local_548.field_2) {
    operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != &local_528.field_2) {
    operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
    operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
    operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658._M_dataplus._M_p != &local_658.field_2) {
    operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1);
  }
  bVar3 = goodform::form::is_good((form *)local_618);
  if ((((((bVar3) && (local_448[0] == (string)0x1)) && (local_448[1] == -8)) &&
       ((local_448._2_2_ == -0x10 && (local_448._4_4_ == -0x20)))) &&
      (((any *)local_448._8_8_ == (any *)0xffffffffffffffc0 &&
       ((local_448[0x10] == '\b' && (local_448._18_2_ == 0x10)))))) &&
     ((local_448._20_4_ == 0x20 && (local_448._24_8_ == 0x40)))) {
    iVar4 = std::__cxx11::string::compare((char *)&local_428);
    if (iVar4 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Simple MsgPack passed.",0x16);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      bVar3 = true;
      std::ostream::flush();
      goto LAB_0011b35b;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Simple MsgPack FAILED!",0x16);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  bVar3 = false;
LAB_0011b35b:
  if (local_428 != local_418) {
    operator_delete(local_428,(ulong)(local_418[0] + 1));
  }
  if ((_Base_ptr)local_618._16_8_ != (_Base_ptr)(local_618 + 0x20)) {
    operator_delete((void *)local_618._16_8_,(ulong)(local_618._32_8_ + 1));
  }
  if (local_638._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_638._M_manager)(_Op_destroy,&local_638,(_Arg *)0x0);
    local_638._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_628._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_628._M_manager)(_Op_destroy,&local_628,(_Arg *)0x0);
    local_628._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return bVar3;
}

Assistant:

bool run_simple_msgpack_test()
{
  std::stringstream ss;
  goodform::any var, var2;
  var = goodform::object_t
    {
      {"bool", true},
      {"int8", std::int8_t(-8)},
      {"int16", std::int8_t(-16)},
      {"int32", std::int8_t(-32)},
      {"int64", std::int8_t(-64)},
      {"uint8", std::uint8_t(8)},
      {"uint16", std::uint8_t(16)},
      {"uint32", std::uint8_t(32)},
      {"uint64", std::uint8_t(64)},
      {"string", std::string("sting value")}
    };

  goodform::msgpack::serialize(var, ss);
  goodform::msgpack::deserialize(ss, var2);

  goodform::form form(var2);

  struct
  {
    bool          boolean;
    std::int8_t   int8;
    std::int16_t  int16;
    std::int32_t  int32;
    std::int64_t  int64;
    std::uint8_t  uint8;
    std::uint16_t uint16;
    std::uint32_t uint32;
    std::uint64_t uint64;
    std::string   str;
  } form_data {
    form.at("bool").boolean().val(),
    form.at("int8").int8().val(),
    form.at("int16").int16().val(),
    form.at("int32").int32().val(),
    form.at("int64").int64().val(),
    form.at("uint8").uint8().val(),
    form.at("uint16").uint16().val(),
    form.at("uint32").uint32().val(),
    form.at("uint64").uint64().val(),
    form.at("string").string().val()
  };

  if (!form.is_good())
  {
    std::cerr << "Simple MsgPack FAILED!" << std::endl;
    return false;
  }

  if (!form_data.boolean
    || form_data.int8 != -8
    || form_data.int16 != -16
    || form_data.int32 != -32
    || form_data.int64 != -64
    || form_data.uint8 != 8
    || form_data.uint16 != 16
    || form_data.uint32 != 32
    || form_data.uint64 != 64
    || form_data.str != "sting value")
  {
    std::cerr << "Simple MsgPack FAILED!" << std::endl;
    return false;
  }


  std::cout << "Simple MsgPack passed." << std::endl;
  return true;
}